

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cui.hpp
# Opt level: O0

int ghc::cui::detail::characterWidth(uint32_t codepoint)

{
  int iVar1;
  uint32_t codepoint_local;
  
  iVar1 = wcwidth(codepoint);
  return iVar1;
}

Assistant:

GHC_INLINE int characterWidth(std::uint32_t codepoint)
{
#ifndef _WIN32
    return ::wcwidth(static_cast<wchar_t>(codepoint));
#else
    return 1 + (codepoint >= 0x1100 && (codepoint <= 0x115f ||                                                                                                // Hangul Jamo init. consonants
                                        codepoint == 0x2329 || codepoint == 0x232a || (codepoint >= 0x2e80 && codepoint <= 0xa4cf && codepoint != 0x303f) ||  // CJK ... Yi
                                        (codepoint >= 0xac00 && codepoint <= 0xd7a3) ||                                                                       // Hangul Syllables
                                        (codepoint >= 0xf900 && codepoint <= 0xfaff) ||                                                                       // CJK Compatibility Ideographs
                                        (codepoint >= 0xfe10 && codepoint <= 0xfe19) ||                                                                       // Vertical forms
                                        (codepoint >= 0xfe30 && codepoint <= 0xfe6f) ||                                                                       // CJK Compatibility Forms
                                        (codepoint >= 0xff00 && codepoint <= 0xff60) ||                                                                       // Fullwidth Forms
                                        (codepoint >= 0xffe0 && codepoint <= 0xffe6) || (codepoint >= 0x20000 && codepoint <= 0x2fffd) || (codepoint >= 0x30000 && codepoint <= 0x3fffd)));
#endif
}